

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O3

UBool __thiscall
icu_63::CollationWeights::allocWeightsInMinLengthRanges
          (CollationWeights *this,int32_t n,int32_t minLength)

{
  uint uVar1;
  uint uVar2;
  UBool UVar3;
  uint32_t uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int32_t iVar9;
  int iVar10;
  int iVar11;
  int32_t *piVar12;
  WeightRange *range;
  int iVar13;
  uint uVar14;
  
  uVar14 = this->rangeCount;
  if ((int)uVar14 < 1) {
    iVar7 = 0;
    uVar6 = 0;
  }
  else {
    piVar12 = &this->ranges[0].count;
    uVar5 = 0;
    iVar7 = 0;
    do {
      uVar6 = uVar5;
      if (piVar12[-1] != minLength) break;
      iVar7 = iVar7 + *piVar12;
      uVar5 = uVar5 + 1;
      piVar12 = piVar12 + 4;
      uVar6 = (ulong)uVar14;
    } while (uVar14 != uVar5);
  }
  iVar10 = this->maxBytes[(long)minLength + 1] - this->minBytes[(long)minLength + 1];
  iVar11 = iVar10 + 1;
  if (iVar11 * iVar7 < n) {
    UVar3 = '\0';
  }
  else {
    uVar4 = this->ranges[0].start;
    uVar14 = this->ranges[0].end;
    if (1 < (uint)uVar6) {
      lVar8 = 0;
      do {
        uVar1 = *(uint *)((long)&this->ranges[1].start + lVar8);
        uVar2 = *(uint *)((long)&this->ranges[1].end + lVar8);
        if (uVar1 < uVar4) {
          uVar4 = uVar1;
        }
        if (uVar14 < uVar2) {
          uVar14 = uVar2;
        }
        lVar8 = lVar8 + 0x10;
      } while ((uVar6 & 0xffffffff) * 0x10 + -0x10 != lVar8);
    }
    range = this->ranges;
    iVar10 = (n - iVar7) / iVar10;
    iVar13 = iVar7 - iVar10;
    if ((iVar10 == 0) || (iVar11 * iVar10 + iVar13 < n)) {
      iVar10 = iVar10 + 1;
      iVar13 = iVar13 + -1;
    }
    range->start = uVar4;
    if (iVar13 == 0) {
      this->ranges[0].end = uVar14;
      iVar9 = 1;
      lVar8 = 0x38;
    }
    else {
      uVar4 = incWeightByOffset(this,uVar4,minLength,iVar13 + -1);
      this->ranges[0].end = uVar4;
      this->ranges[0].count = iVar13;
      uVar4 = incWeight(this,uVar4,minLength);
      range = this->ranges + 1;
      this->ranges[1].start = uVar4;
      this->ranges[1].end = uVar14;
      this->ranges[1].length = minLength;
      iVar9 = 2;
      lVar8 = 0x48;
      iVar7 = iVar10;
    }
    *(int *)((long)this->minBytes + lVar8 + -4) = iVar7;
    lengthenRange(this,range);
    this->rangeCount = iVar9;
    UVar3 = '\x01';
  }
  return UVar3;
}

Assistant:

UBool
CollationWeights::allocWeightsInMinLengthRanges(int32_t n, int32_t minLength) {
    // See if the minLength ranges have enough weights
    // when we split one and lengthen the following ones.
    int32_t count = 0;
    int32_t minLengthRangeCount;
    for(minLengthRangeCount = 0;
            minLengthRangeCount < rangeCount &&
                ranges[minLengthRangeCount].length == minLength;
            ++minLengthRangeCount) {
        count += ranges[minLengthRangeCount].count;
    }

    int32_t nextCountBytes = countBytes(minLength + 1);
    if(n > count * nextCountBytes) { return FALSE; }

    // Use the minLength ranges. Merge them, and then split again as necessary.
    uint32_t start = ranges[0].start;
    uint32_t end = ranges[0].end;
    for(int32_t i = 1; i < minLengthRangeCount; ++i) {
        if(ranges[i].start < start) { start = ranges[i].start; }
        if(ranges[i].end > end) { end = ranges[i].end; }
    }

    // Calculate how to split the range between minLength (count1) and minLength+1 (count2).
    // Goal:
    //   count1 + count2 * nextCountBytes = n
    //   count1 + count2 = count
    // These turn into
    //   (count - count2) + count2 * nextCountBytes = n
    // and then into the following count1 & count2 computations.
    int32_t count2 = (n - count) / (nextCountBytes - 1);  // number of weights to be lengthened
    int32_t count1 = count - count2;  // number of minLength weights
    if(count2 == 0 || (count1 + count2 * nextCountBytes) < n) {
        // round up
        ++count2;
        --count1;
        U_ASSERT((count1 + count2 * nextCountBytes) >= n);
    }

    ranges[0].start = start;

    if(count1 == 0) {
        // Make one long range.
        ranges[0].end = end;
        ranges[0].count = count;
        lengthenRange(ranges[0]);
        rangeCount = 1;
    } else {
        // Split the range, lengthen the second part.
#ifdef UCOL_DEBUG
        printf("split the range number %ld (out of %ld minLength ranges) by %ld:%ld\n",
               splitRange, rangeCount, count1, count2);
#endif

        // Next start = start + count1. First end = 1 before that.
        ranges[0].end = incWeightByOffset(start, minLength, count1 - 1);
        ranges[0].count = count1;

        ranges[1].start = incWeight(ranges[0].end, minLength);
        ranges[1].end = end;
        ranges[1].length = minLength;  // +1 when lengthened
        ranges[1].count = count2;  // *countBytes when lengthened
        lengthenRange(ranges[1]);
        rangeCount = 2;
    }
    return TRUE;
}